

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_suite.cpp
# Opt level: O0

void value_suite::fail_double_as_map(void)

{
  error_code eVar1;
  int local_90 [2];
  error_category *local_88;
  type local_78;
  undefined1 local_48 [8];
  error_code error;
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>
            ((basic_variable<std::allocator<char>_> *)&error._M_cat,0.0);
  std::error_code::error_code((error_code *)local_48);
  trial::dynamic::basic_variable<std::allocator<char>>::
  value<trial::dynamic::basic_map<std::allocator<char>>>
            (&local_78,(basic_variable<std::allocator<char>> *)&error._M_cat,(error_code *)local_48)
  ;
  std::
  map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>
  ::~map(&local_78);
  eVar1 = trial::dynamic::make_error_code(incompatible_type);
  local_88 = eVar1._M_cat;
  local_90[0] = eVar1._M_value;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::error_code,std::error_code>
            ("error","make_error_code(incompatible_type)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x16bf,"void value_suite::fail_double_as_map()",local_48,local_90);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&error._M_cat);
  return;
}

Assistant:

void fail_double_as_map()
{
    variable data(0.0);
    std::error_code error;
    data.value<map>(error);
    TRIAL_PROTOCOL_TEST_EQUAL(error, make_error_code(incompatible_type));
}